

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O3

int Vec_BitCount(Vec_Bit_t *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long in_RSI;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (uint)(((ulong)p & 0x1f) != 0) + ((int)p >> 5);
  if (((ulong)p & 0x1f) == 0) {
    if ((int)uVar4 < 1) {
      iVar2 = 0;
    }
    else {
      uVar3 = 0;
      iVar2 = 0;
      do {
        uVar1 = *(uint *)(in_RSI + uVar3 * 4);
        uVar1 = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
        uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
        uVar1 = (uVar1 >> 4 & 0x7070707) + (uVar1 & 0x7070707);
        uVar1 = (uVar1 >> 8 & 0xf000f) + (uVar1 & 0xf000f);
        iVar2 = (uVar1 >> 0x10) + iVar2 + (uVar1 & 0xffff);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else {
    if ((int)uVar4 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x256,"int Vec_BitCount(Vec_Bit_t *)");
    }
    if (uVar4 == 1) {
      uVar5 = 0;
      iVar2 = 0;
    }
    else {
      uVar5 = (ulong)(uVar4 - 1);
      uVar3 = 0;
      iVar2 = 0;
      do {
        uVar4 = *(uint *)(in_RSI + uVar3 * 4);
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar2 = iVar2 + (uVar4 >> 0x10) + (uVar4 & 0xffff);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    uVar4 = ~(-1 << ((byte)p & 0x1f)) & *(uint *)(in_RSI + uVar5 * 4);
    uVar4 = (uVar4 >> 1 & 0x15555555) + (uVar4 & 0x55555555);
    uVar4 = (uVar4 >> 2 & 0x13333333) + (uVar4 & 0x33333333);
    uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
    uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
    iVar2 = (uVar4 >> 0x10) + iVar2 + (uVar4 & 0xffff);
  }
  return iVar2;
}

Assistant:

static inline int Vec_BitCount( Vec_Bit_t * p ) 
{
    unsigned * pArray = (unsigned *)p->pArray;
    int nWords = (p->nSize >> 5) + ((p->nSize & 31) > 0);
    int i, Counter = 0;
    if ( p->nSize & 31 )
    {
        assert( nWords > 0 );
        for ( i = 0; i < nWords-1; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
        Counter += Vec_BitCountWord( pArray[i] & ~(~0 << (p->nSize & 31)) );
    }
    else
    {
        for ( i = 0; i < nWords; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
    }
    return Counter;
}